

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  value_t vVar1;
  basic_value<toml::type_config> *in_RSI;
  value_with_format<long,_toml::integer_format_info> *in_RDI;
  region *in_stack_ffffffffffffffb8;
  format_type *this_00;
  value_with_format<long,_toml::integer_format_info> *v_00;
  char local_1d [13];
  basic_value<toml::type_config> *local_10;
  
  local_10 = in_RSI;
  vVar1 = type(in_RSI);
  *(value_t *)&in_RDI->value = vVar1;
  this_00 = &in_RDI[1].format;
  toml::detail::region::region((region *)this_00,in_stack_ffffffffffffffb8);
  v_00 = (value_with_format<long,_toml::integer_format_info> *)&in_RDI[2].format.suffix.field_2;
  preserve_comments::preserve_comments
            ((preserve_comments *)this_00,(preserve_comments *)in_stack_ffffffffffffffb8);
  switch((char)in_RDI->value) {
  case '\x01':
    assigner<toml::detail::value_with_format<bool,toml::boolean_format_info>,toml::detail::value_with_format<bool,toml::boolean_format_info>>
              ((value_with_format<bool,_toml::boolean_format_info> *)&in_RDI->format,
               &(local_10->field_1).boolean_);
    break;
  case '\x02':
    assigner<toml::detail::value_with_format<long,toml::integer_format_info>,toml::detail::value_with_format<long,toml::integer_format_info>>
              (in_RDI,v_00);
    break;
  case '\x03':
    assigner<toml::detail::value_with_format<double,toml::floating_format_info>,toml::detail::value_with_format<double,toml::floating_format_info>>
              ((value_with_format<double,_toml::floating_format_info> *)in_RDI,
               (value_with_format<double,_toml::floating_format_info> *)v_00);
    break;
  case '\x04':
    assigner<toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>,toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>>
              ((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                *)in_RDI,
               (value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                *)v_00);
    break;
  case '\x05':
    assigner<toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>,toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>>
              ((value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
               &in_RDI->format,
               (value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
               &(local_10->field_1).boolean_);
    break;
  case '\x06':
    assigner<toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>,toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>>
              ((value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
               &in_RDI->format,
               (value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
               &(local_10->field_1).boolean_);
    break;
  case '\a':
    assigner<toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>,toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>>
              ((value_with_format<toml::local_date,_toml::local_date_format_info> *)&in_RDI->format,
               (value_with_format<toml::local_date,_toml::local_date_format_info> *)
               &(local_10->field_1).boolean_);
    break;
  case '\b':
    assigner<toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>,toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>>
              ((value_with_format<toml::local_time,_toml::local_time_format_info> *)&in_RDI->format,
               (value_with_format<toml::local_time,_toml::local_time_format_info> *)
               &(local_10->field_1).boolean_);
    break;
  case '\t':
    assigner<toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>,toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>>
              ((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                *)in_RDI,
               (value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                *)v_00);
    break;
  case '\n':
    assigner<toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>,toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>>
              ((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                *)in_RDI,
               (value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                *)v_00);
    break;
  default:
    local_1d[0] = '\0';
    assigner<char,char>((char *)&in_RDI->format,local_1d);
  }
  return;
}

Assistant:

basic_value(basic_value&& v)
        : type_(v.type()), region_(std::move(v.region_)),
          comments_(std::move(v.comments_))
    {
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , std::move(v.boolean_        )); break;
            case value_t::integer        : assigner(integer_        , std::move(v.integer_        )); break;
            case value_t::floating       : assigner(floating_       , std::move(v.floating_       )); break;
            case value_t::string         : assigner(string_         , std::move(v.string_         )); break;
            case value_t::offset_datetime: assigner(offset_datetime_, std::move(v.offset_datetime_)); break;
            case value_t::local_datetime : assigner(local_datetime_ , std::move(v.local_datetime_ )); break;
            case value_t::local_date     : assigner(local_date_     , std::move(v.local_date_     )); break;
            case value_t::local_time     : assigner(local_time_     , std::move(v.local_time_     )); break;
            case value_t::array          : assigner(array_          , std::move(v.array_          )); break;
            case value_t::table          : assigner(table_          , std::move(v.table_          )); break;
            default                      : assigner(empty_          , '\0'                         ); break;
        }
    }